

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::SSLTest_EarlyCallbackVersionSwitch_Test::TestBody
          (SSLTest_EarlyCallbackVersionSwitch_Test *this)

{
  bool bVar1;
  int iVar2;
  SSL_METHOD *method;
  SSL_METHOD *meth;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *pcVar3;
  char *in_R9;
  UniquePtr<SSL> client;
  UniquePtr<SSL> server;
  AssertHelper local_98;
  AssertionResult gtest_ar_;
  UniquePtr<SSL_CTX> server_ctx;
  UniquePtr<SSL_CTX> client_ctx;
  AssertHelper local_70;
  AssertionResult gtest_ar;
  
  method = TLS_method();
  CreateContextWithTestCertificate((anon_unknown_0 *)&server_ctx,method);
  meth = (SSL_METHOD *)TLS_method();
  client_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<ssl_ctx_st,_bssl::internal::Deleter,_true,_true>)SSL_CTX_new(meth);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)
       server_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl !=
       (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)0x0;
  if ((__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)
      server_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl ==
      (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)0x0) {
    testing::Message::Message((Message *)&client);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"server_ctx","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&server,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1016,(char *)gtest_ar._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&server,(Message *)&client);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ =
         (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)
         client_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
         super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl !=
         (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)0x0;
    if ((__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)
        client_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl ==
        (__uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>)0x0) {
      testing::Message::Message((Message *)&client);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar,(internal *)&gtest_ar_,(AssertionResult *)"client_ctx","false",
                 "true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&server,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1017,(char *)gtest_ar._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&server,(Message *)&client);
    }
    else {
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar_.message_);
      iVar2 = SSL_CTX_set_max_proto_version
                        ((SSL_CTX *)
                         client_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
                         _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                         super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,0x304);
      gtest_ar_.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0;
      gtest_ar_.success_ = iVar2 != 0;
      if (iVar2 == 0) {
        testing::Message::Message((Message *)&client);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,
                   (AssertionResult *)"SSL_CTX_set_max_proto_version(client_ctx.get(), 0x0304)",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&server,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1018,(char *)gtest_ar._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&server,(Message *)&client);
      }
      else {
        std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~unique_ptr(&gtest_ar_.message_);
        iVar2 = SSL_CTX_set_max_proto_version
                          ((SSL_CTX *)
                           server_ctx._M_t.
                           super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,0x304);
        gtest_ar_.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )0x0;
        gtest_ar_.success_ = iVar2 != 0;
        if (iVar2 != 0) {
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(&gtest_ar_.message_);
          SSL_CTX_set_select_certificate_cb
                    ((SSL_CTX *)
                     server_ctx._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t
                     .super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                     TestBody::anon_class_1_0_00000001::__invoke);
          client._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl =
               (__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>)
               (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0;
          server._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl =
               (__uniq_ptr_data<ssl_st,_bssl::internal::Deleter,_true,_true>)
               (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0;
          gtest_ar.success_ = false;
          gtest_ar._1_7_ = 0;
          gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          pcVar3 = (char *)0x1;
          bVar1 = ConnectClientAndServer
                            (&client,&server,
                             (SSL_CTX *)
                             client_ctx._M_t.
                             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                             (SSL_CTX *)
                             server_ctx._M_t.
                             super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl,
                             (ClientConfig *)&gtest_ar,true);
          this_00 = &gtest_ar_.message_;
          gtest_ar_.success_ = bVar1;
          gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl =
               (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )0x0;
          ClientConfig::~ClientConfig((ClientConfig *)&gtest_ar);
          if (gtest_ar_.success_ == false) {
            testing::Message::Message((Message *)&local_98);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar,(internal *)&gtest_ar_,
                       (AssertionResult *)
                       "ConnectClientAndServer(&client, &server, client_ctx.get(), server_ctx.get())"
                       ,"false","true",pcVar3);
            testing::internal::AssertHelper::AssertHelper
                      (&local_70,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1027,(char *)gtest_ar._0_8_);
            testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_98);
            testing::internal::AssertHelper::~AssertHelper(&local_70);
            std::__cxx11::string::~string((string *)&gtest_ar);
            if ((long *)CONCAT44(local_98.data_._4_4_,(int)local_98.data_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,(int)local_98.data_) + 8))();
            }
          }
          else {
            std::
            unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~unique_ptr(this_00);
            gtest_ar_.success_ = true;
            gtest_ar_._1_3_ = 3;
            local_98.data_._0_4_ =
                 SSL_version((SSL *)client._M_t.
                                    super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                                    super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                                    super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl);
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&gtest_ar,"0x0303","SSL_version(client.get())",(int *)&gtest_ar_,
                       (int *)&local_98);
            if (gtest_ar.success_ == false) {
              testing::Message::Message((Message *)&gtest_ar_);
              if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl ==
                  (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )0x0) {
                pcVar3 = "";
              }
              else {
                pcVar3 = *(char **)gtest_ar.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_98,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x1028,pcVar3);
              testing::internal::AssertHelper::operator=(&local_98,(Message *)&gtest_ar_);
              testing::internal::AssertHelper::~AssertHelper(&local_98);
              if ((long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT44(gtest_ar_._4_4_,gtest_ar_._0_4_) + 8))();
              }
            }
            this_00 = &gtest_ar.message_;
          }
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr(this_00);
          std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&server);
          std::unique_ptr<ssl_st,_bssl::internal::Deleter>::~unique_ptr(&client);
          goto LAB_001771e8;
        }
        testing::Message::Message((Message *)&client);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar,(internal *)&gtest_ar_,
                   (AssertionResult *)"SSL_CTX_set_max_proto_version(server_ctx.get(), 0x0304)",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&server,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1019,(char *)gtest_ar._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&server,(Message *)&client);
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&server);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if ((__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)
      client._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>)0x0) {
    (**(code **)(*(long *)client._M_t.super___uniq_ptr_impl<ssl_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_ssl_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_st_*,_false>._M_head_impl + 8))();
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
LAB_001771e8:
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&client_ctx);
  std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::~unique_ptr(&server_ctx);
  return;
}

Assistant:

TEST(SSLTest, EarlyCallbackVersionSwitch) {
  bssl::UniquePtr<SSL_CTX> server_ctx =
      CreateContextWithTestCertificate(TLS_method());
  bssl::UniquePtr<SSL_CTX> client_ctx(SSL_CTX_new(TLS_method()));
  ASSERT_TRUE(server_ctx);
  ASSERT_TRUE(client_ctx);
  ASSERT_TRUE(SSL_CTX_set_max_proto_version(client_ctx.get(), TLS1_3_VERSION));
  ASSERT_TRUE(SSL_CTX_set_max_proto_version(server_ctx.get(), TLS1_3_VERSION));

  SSL_CTX_set_select_certificate_cb(
      server_ctx.get(),
      [](const SSL_CLIENT_HELLO *client_hello) -> ssl_select_cert_result_t {
        if (!SSL_set_max_proto_version(client_hello->ssl, TLS1_2_VERSION)) {
          return ssl_select_cert_error;
        }

        return ssl_select_cert_success;
      });

  bssl::UniquePtr<SSL> client, server;
  ASSERT_TRUE(ConnectClientAndServer(&client, &server, client_ctx.get(),
                                     server_ctx.get()));
  EXPECT_EQ(TLS1_2_VERSION, SSL_version(client.get()));
}